

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sve_helper.c
# Opt level: O2

void helper_sve_cpy_m_b_aarch64(void *vd,void *vn,void *vg,uint64_t mm,uint32_t desc)

{
  ulong uVar1;
  ulong uVar2;
  
  for (uVar2 = 0; (desc & 0x1f) * 8 + 8 >> 3 != uVar2; uVar2 = uVar2 + 1) {
    uVar1 = *(ulong *)((long)vn + uVar2 * 8);
    *(uint64_t *)((long)vd + uVar2 * 8) =
         ((mm & 0xff) * 0x101010101010101 ^ uVar1) &
         *(ulong *)(expand_pred_b_word + (ulong)*(byte *)((long)vg + uVar2) * 8) ^ uVar1;
  }
  return;
}

Assistant:

void HELPER(sve_cpy_m_b)(void *vd, void *vn, void *vg,
                         uint64_t mm, uint32_t desc)
{
    intptr_t i, opr_sz = simd_oprsz(desc) / 8;
    uint64_t *d = vd, *n = vn;
    uint8_t *pg = vg;

    mm = dup_const(MO_8, mm);
    for (i = 0; i < opr_sz; i += 1) {
        uint64_t nn = n[i];
        uint64_t pp = expand_pred_b(pg[H1(i)]);
        d[i] = (mm & pp) | (nn & ~pp);
    }
}